

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O2

void __thiscall xemmai::t_lexer::t_lexer(t_lexer *this,wstring_view a_path,FILE *a_stream)

{
  long lVar1;
  t_object *ptVar2;
  wint_t wVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  allocator<wchar_t> local_21;
  wstring_view a_path_local;
  
  a_path_local._M_str = a_path._M_str;
  a_path_local._M_len = a_path._M_len;
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)this,&a_path_local,&local_21);
  this->v_stream = a_stream;
  this->v_position = 0;
  this->v_line = 1;
  this->v_column = 1;
  wVar3 = getwc((__FILE *)a_stream);
  this->v_c = wVar3;
  (this->v_at).v_column = 0;
  (this->v_at).v_position = 0;
  (this->v_at).v_line = 0;
  lVar1 = *(long *)(in_FS_OFFSET + -0x78);
  ptVar2 = *(t_object **)(lVar1 + 0x2e8);
  (this->v_indent).v_p = ptVar2;
  pcVar4 = ptVar2->v_data + 8;
  (this->v_indent).v_i = (wchar_t *)pcVar4;
  (this->v_indent).v_j = (wchar_t *)pcVar4;
  ptVar2 = *(t_object **)(lVar1 + 0x2e8);
  (this->v_value).v_p = ptVar2;
  pcVar4 = ptVar2->v_data + 8;
  (this->v_value).v_i = (wchar_t *)pcVar4;
  (this->v_value).v_j = (wchar_t *)pcVar4;
  while( true ) {
    f_read_indent(this);
    if ((this->v_c != 10) && (this->v_c != 0x23)) break;
    (this->v_indent).v_i = (wchar_t *)(((this->v_indent).v_p)->v_data + 8);
    f_skip_line(this);
  }
  f_next(this);
  return;
}

Assistant:

t_lexer::t_lexer(std::wstring_view a_path, std::FILE* a_stream) : v_path(a_path), v_stream(a_stream), v_c(std::getwc(v_stream))
{
	while (true) {
		f_read_indent();
		if (v_c != L'\n' && v_c != L'#') break;
		v_indent.f_rewind(0);
		f_skip_line();
	}
	f_next();
}